

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall Liby::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  int *piVar2;
  undefined8 *puVar3;
  char *pcVar4;
  sockaddr_in address;
  sockaddr local_20;
  
  if ((this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    createSocket(this);
  }
  FileDescriptor::set_noblock
            ((this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,true);
  local_20.sa_family = 2;
  local_20.sa_data._2_4_ = (this->ep_).addr_;
  local_20.sa_data._0_2_ = (this->ep_).port_;
  uVar1 = ::connect(this->fd_,&local_20,0x10);
  piVar2 = (int *)(ulong)uVar1;
  if ((int)uVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x73) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar4 = strerror(*piVar2);
      *puVar3 = pcVar4;
      __cxa_throw(puVar3,&char*::typeinfo,0);
    }
  }
  return (int)piVar2;
}

Assistant:

void Socket::connect() {
    if (!fp_) {
        createSocket();
    }

    setNoblock();

    struct sockaddr_in address;
    address.sin_family = AF_INET;
    //    address.sin_len = sizeof(address);
    struct in_addr in_addr1;
    in_addr1.s_addr = ep_.addr_;
    address.sin_addr = in_addr1;
    address.sin_port = ep_.port_;

    int ret = ::connect(fd_, (struct sockaddr *)&address, sizeof(address));
    if (ret < 0 && errno != EINPROGRESS) {
        throw ::strerror(errno);
    }
}